

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear.cpp
# Opt level: O2

void __thiscall LinearNE<0,_1,_1>::wakeup(LinearNE<0,_1,_1> *this,int i,int param_2)

{
  bool bVar1;
  int iVar2;
  
  if (i < this->sz) {
    Tint::operator=(&this->num_unfixed,(this->num_unfixed).v + -1);
    if (i < *(int *)&(this->super_Propagator).field_0x14) {
      iVar2 = ((this->x[i].var)->min).v;
    }
    else {
      iVar2 = -((this->y[i].var)->min).v;
    }
    Tint64_t::operator=(&this->sum_fixed,(this->sum_fixed).v + (long)iVar2);
  }
  if ((this->num_unfixed).v < 2) {
    bVar1 = BoolView::isTrue(&this->r);
    if ((bVar1) || ((sat.assigns.data[(uint)(this->r).v] == '\0' && ((this->num_unfixed).v == 0))))
    {
      Propagator::pushInQueue(&this->super_Propagator);
      return;
    }
  }
  return;
}

Assistant:

void wakeup(int i, int /*c*/) override {
		if (i < sz) {
			num_unfixed = num_unfixed - 1;
			if (i < sp) {
				sum_fixed = sum_fixed + x[i].getVal();
			} else {
				sum_fixed = sum_fixed + y[i].getVal();
			}
		}
		if (num_unfixed > 1) {
			return;
		}
		if ((R == 0) || r.isTrue() || (!r.isFixed() && num_unfixed == 0)) {
			pushInQueue();
		}
	}